

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float4x4 *
ConvexDecomposition::MatrixLookAt
          (float4x4 *__return_storage_ptr__,float3 *eye,float3 *at,float3 *up)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar10 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  float3 fVar11;
  float4x4 m;
  float3 local_78;
  float4x4 local_68;
  
  local_68.x.x = 0.0;
  local_68.x.y = 0.0;
  local_68.x.z = 0.0;
  local_68.x.w = 0.0;
  local_68.y.x = 0.0;
  local_68.y.y = 0.0;
  local_68.y.z = 0.0;
  local_68.y.w = 0.0;
  local_68.z.x = 0.0;
  local_68.z.y = 0.0;
  local_68.z.z = 0.0;
  local_68.z.w = 0.0;
  local_68.w.x = eye->x;
  local_68.w.y = eye->y;
  local_68.w.w = 1.0;
  local_68.w.z = eye->z;
  auVar1 = vinsertps_avx(ZEXT416((uint)(eye->x - at->x)),ZEXT416((uint)(eye->y - at->y)),0x10);
  local_78.z = eye->z - at->z;
  local_78._0_8_ = vmovlps_avx(auVar1);
  auVar7 = ZEXT856(auVar1._8_8_);
  auVar10 = (undefined1  [60])0x0;
  fVar11 = normalize(&local_78);
  auVar8._0_4_ = fVar11.z;
  auVar8._4_60_ = auVar10;
  auVar5._0_8_ = fVar11._0_8_;
  auVar5._8_56_ = auVar7;
  local_68.z._0_8_ = vmovlps_avx(auVar5._0_16_);
  local_68.z.z = auVar8._0_4_;
  auVar7 = (undefined1  [56])0x0;
  fVar3 = local_68.z.x;
  fVar4 = local_68.z.y;
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(local_68.z.y * up->z)),ZEXT416((uint)up->y),auVar8._0_16_)
  ;
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * up->x)),ZEXT416((uint)local_68.z.x),
                           ZEXT416((uint)up->z));
  auVar1 = vinsertps_avx(auVar1,auVar2,0x10);
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(local_68.z.x * up->y)),ZEXT416((uint)local_68.z.y),
                           ZEXT416((uint)up->x));
  auVar10 = ZEXT1260(auVar2._4_12_);
  local_78._0_8_ = vmovlps_avx(auVar1);
  local_78.z = auVar2._0_4_;
  fVar11 = normalize(&local_78);
  auVar9._0_4_ = fVar11.z;
  auVar9._4_60_ = auVar10;
  auVar6._0_8_ = fVar11._0_8_;
  auVar6._8_56_ = auVar7;
  local_68.x._0_8_ = vmovlps_avx(auVar6._0_16_);
  local_68.x.z = auVar9._0_4_;
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(local_68.x.y * auVar8._0_4_)),ZEXT416((uint)fVar4),
                           auVar9._0_16_);
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar3)),ZEXT416((uint)local_68.x.x),
                           ZEXT416((uint)auVar8._0_4_));
  auVar1 = vinsertps_avx(auVar1,auVar2,0x10);
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(local_68.x.x * fVar4)),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_68.x.y));
  local_68.y._0_8_ = vmovlps_avx(auVar1);
  local_68.y.z = auVar2._0_4_;
  MatrixRigidInverse(__return_storage_ptr__,&local_68);
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixLookAt(const float3& eye, const float3& at, const float3& up)
{
	float4x4 m;
	m.w.w = 1.0f;
	m.w.xyz() = eye;
	m.z.xyz() = normalize(eye-at);
	m.x.xyz() = normalize(cross(up,m.z.xyz()));
	m.y.xyz() = cross(m.z.xyz(),m.x.xyz());
	return MatrixRigidInverse(m);
}